

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

uint8_t * __thiscall
Lodtalk::MethodAssembler::PopStoreTemporal::encode(PopStoreTemporal *this,uint8_t *buffer)

{
  if (this->index < 8) {
    *buffer = (char)this->index + 0xd0;
    return buffer + 1;
  }
  *buffer = 0xf2;
  buffer[1] = (uint8_t)this->index;
  return buffer + 2;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
        if(index < BytecodeSet::PopStoreTemporalVariableShortRangeSize)
        {
            *buffer++ = uint8_t(BytecodeSet::PopStoreTemporalVariableShortFirst + index);
            return buffer;
        }

        *buffer++ = BytecodeSet::PopStoreTemporalVariable;
        *buffer++ = (uint8_t)index;
        return buffer;
	}